

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testSize<Imath_3_2::Vec2<int>>(char *type)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  uint *puVar4;
  int *piVar5;
  char *in_RDI;
  Box<Imath_3_2::Vec2<int>_> b_1;
  Vec2<int> max;
  Vec2<int> min;
  Box<Imath_3_2::Vec2<int>_> b1;
  uint i;
  Vec2<int> p;
  Box<Imath_3_2::Vec2<int>_> b0;
  Box<Imath_3_2::Vec2<int>_> b;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  uint uVar6;
  int in_stack_ffffffffffffff44;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff48;
  Box<Imath_3_2::Vec2<int>_> *in_stack_ffffffffffffff50;
  Vec2<int> local_a4;
  Vec2<int> local_9c;
  Vec2<int> local_94;
  Vec2<int> local_8c;
  Vec2<int> local_84 [4];
  uint local_64;
  Vec2<int> local_60;
  Vec2<int> local_58;
  Vec2<int> local_50;
  Vec2<int> local_48;
  Vec2<int> local_40 [3];
  Vec2<int> local_28;
  Vec2<int> local_20 [3];
  char *local_8;
  
  local_8 = in_RDI;
  poVar3 = std::operator<<((ostream *)&std::cout,"    size() for type ");
  poVar3 = std::operator<<(poVar3,local_8);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            ((Box<Imath_3_2::Vec2<int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size(in_stack_ffffffffffffff48);
  Imath_3_2::Vec2<int>::Vec2(&local_28,0);
  bVar1 = Imath_3_2::Vec2<int>::operator==(local_20,&local_28);
  if (!bVar1) {
    __assert_fail("b.size () == T (0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x268,
                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec2<int>]");
  }
  Imath_3_2::Vec2<int>::Vec2(local_40,-1);
  Imath_3_2::Vec2<int>::Vec2(&local_48,1);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->min,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size(in_stack_ffffffffffffff48);
  Imath_3_2::Vec2<int>::Vec2(&local_58,2);
  bVar1 = Imath_3_2::Vec2<int>::operator==(&local_50,&local_58);
  if (!bVar1) {
    __assert_fail("b0.size () == T (2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x27a,
                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec2<int>]");
  }
  Imath_3_2::Vec2<int>::Vec2(&local_60);
  local_64 = 0;
  while( true ) {
    uVar6 = local_64;
    uVar2 = Imath_3_2::Vec2<int>::dimensions();
    if (uVar2 <= uVar6) break;
    in_stack_ffffffffffffff3c = local_64;
    puVar4 = (uint *)Imath_3_2::Vec2<int>::operator[](&local_60,local_64);
    *puVar4 = in_stack_ffffffffffffff3c;
    local_64 = local_64 + 1;
  }
  Imath_3_2::Vec2<int>::operator-
            ((Vec2<int> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->min,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff44,uVar6));
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size(in_stack_ffffffffffffff48);
  Imath_3_2::Vec2<int>::Vec2(&local_94,2);
  Imath_3_2::Vec2<int>::operator*
            (&in_stack_ffffffffffffff48->min,(Vec2<int> *)CONCAT44(in_stack_ffffffffffffff44,uVar6))
  ;
  bVar1 = Imath_3_2::Vec2<int>::operator==(local_84,&local_8c);
  if (!bVar1) {
    __assert_fail("b1.size () == p * T (2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x282,
                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec2<int>]");
  }
  Imath_3_2::Vec2<int>::Vec2(&local_9c,0);
  Imath_3_2::Vec2<int>::Vec2(&local_a4,&local_9c);
  uVar2 = Imath_3_2::Vec2<int>::dimensions();
  piVar5 = Imath_3_2::Vec2<int>::operator[](&local_a4,uVar2 - 1);
  *piVar5 = 1;
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_ffffffffffffff50,&in_stack_ffffffffffffff48->min,
             (Vec2<int> *)CONCAT44(in_stack_ffffffffffffff44,uVar6));
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::size(in_stack_ffffffffffffff48);
  bVar1 = Imath_3_2::Vec2<int>::operator==((Vec2<int> *)&stack0xffffffffffffff44,&local_a4);
  if (!bVar1) {
    __assert_fail("b.size () == max",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x293,
                  "void (anonymous namespace)::testSize(const char *) [T = Imath_3_2::Vec2<int>]");
  }
  return;
}

Assistant:

void
testSize (const char* type)
{
    cout << "    size() for type " << type << endl;

    //
    // Size of empty box.
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert (b.size () == T (0));
    }

    //
    // Size of non-empty, has-volume box.
    // Boxes are:
    //    2D: [(-1, -1),         (1, 1)       ]
    //    3D: [(-1, -1, -1),     (1, 1, 1)    ]
    //    4D: [(-1, -1, -1, -1), (1, 1, 1, 1) ]
    //
    // and
    //
    //    2D: [(-1, -2),         (1, 2)       ]
    //    3D: [(-1, -2, -3),     (1, 2, 3)    ]
    //    4D: [(-1, -2, -3, -4), (1, 2, 3, 4) ]
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b0 (T (-1), T (1));
        assert (b0.size () == T (2));

        T p;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            p[i] = static_cast<typename T::BaseType>(i);
        }
        IMATH_INTERNAL_NAMESPACE::Box<T> b1 (-p, p);
        assert (b1.size () == p * T (2));
    }

    //
    // Size of non-empty, no-volume box.
    // Boxes are:
    //    2D: [(0, 0),       (0, 1)      ]
    //    3D: [(0, 0, 0),    (0, 0, 1)   ]
    //    4D: [(0, 0, 0, 0), (0, 0, 0, 1)]
    //
    {
        T min (0);
        T max                     = min;
        max[T::dimensions () - 1] = 1;

        IMATH_INTERNAL_NAMESPACE::Box<T> b (min, max);

        assert (b.size () == max);
    }
}